

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::ReadNumAlignmentChunks
          (BamStandardIndex *this,int *numAlignmentChunks)

{
  uint uVar1;
  IBamIODevice *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  BamException *this_00;
  string local_68;
  string local_48;
  
  pIVar2 = (this->m_resources).Device;
  iVar3 = (*pIVar2->_vptr_IBamIODevice[5])(pIVar2,numAlignmentChunks,4);
  if (this->m_isBigEndian == true) {
    uVar1 = *numAlignmentChunks;
    *numAlignmentChunks =
         uVar1 << 0x18 | (int)uVar1 >> 0x18 | (uVar1 & 0xff00) << 8 | uVar1 >> 8 & 0xff00;
  }
  if (CONCAT44(extraout_var,iVar3) == 4) {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"BamStandardIndex::ReadNumAlignmentChunks","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"could not read BAI chunk count","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::ReadNumAlignmentChunks(int& numAlignmentChunks)
{
    const int64_t numBytesRead =
        m_resources.Device->Read((char*)&numAlignmentChunks, sizeof(numAlignmentChunks));
    if (m_isBigEndian) SwapEndian_32(numAlignmentChunks);
    if (numBytesRead != sizeof(numAlignmentChunks))
        throw BamException("BamStandardIndex::ReadNumAlignmentChunks",
                           "could not read BAI chunk count");
}